

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O2

shared_ptr<const_tchecker::lvalue_expression_t> __thiscall
tchecker::typed_int_to_clock_assign_statement_t::clock_ptr
          (typed_int_to_clock_assign_statement_t *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long lVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_tchecker::lvalue_expression_t> sVar3;
  shared_ptr<const_tchecker::lvalue_expression_t> local_20;
  
  std::
  dynamic_pointer_cast<tchecker::typed_lvalue_expression_t_const,tchecker::lvalue_expression_t_const>
            (&local_20);
  _Var1._M_pi = local_20.
                super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (local_20.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = (long)&(local_20.
                    super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->field_0x0 +
            *(long *)((long)*local_20.
                             super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + -0x40);
  }
  *(long *)&(this->super_typed_assign_statement_t).super_typed_statement_t = lVar2;
  local_20.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &(this->super_typed_assign_statement_t).super_typed_statement_t._type = _Var1._M_pi;
  local_20.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.
              super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar3.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_tchecker::lvalue_expression_t>)
         sVar3.super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<tchecker::lvalue_expression_t const> typed_int_to_clock_assign_statement_t::clock_ptr() const
{
  return lvalue_ptr();
}